

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_logical_plan.cpp
# Opt level: O2

idx_t duckdb::GetMaxTableIndex(LogicalOperator *op)

{
  pointer puVar1;
  unsigned_long *index;
  type op_00;
  idx_t iVar2;
  ulong uVar3;
  vector<unsigned_long,_true> *__range1;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *child;
  pointer this;
  vector<unsigned_long,_true> indexes;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  
  puVar1 = (op->children).
           super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar3 = 0;
  for (this = (op->children).
              super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start; this != puVar1; this = this + 1) {
    op_00 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator*(this);
    iVar2 = GetMaxTableIndex(op_00);
    if (uVar3 <= iVar2) {
      uVar3 = iVar2;
    }
  }
  (*op->_vptr_LogicalOperator[0xd])(&local_38,op);
  for (; local_38._M_impl.super__Vector_impl_data._M_start !=
         local_38._M_impl.super__Vector_impl_data._M_finish;
      local_38._M_impl.super__Vector_impl_data._M_start =
           local_38._M_impl.super__Vector_impl_data._M_start + 1) {
    if (uVar3 <= *local_38._M_impl.super__Vector_impl_data._M_start) {
      uVar3 = *local_38._M_impl.super__Vector_impl_data._M_start;
    }
  }
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_38);
  return uVar3;
}

Assistant:

idx_t GetMaxTableIndex(LogicalOperator &op) {
	idx_t result = 0;
	for (auto &child : op.children) {
		auto max_child_index = GetMaxTableIndex(*child);
		result = MaxValue<idx_t>(result, max_child_index);
	}
	auto indexes = op.GetTableIndex();
	for (auto &index : indexes) {
		result = MaxValue<idx_t>(result, index);
	}
	return result;
}